

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

void Amap_ManMerge(Amap_Man_t *p)

{
  abctime aVar1;
  Amap_Cut_t *pAVar2;
  Amap_Obj_t *pNode;
  abctime aVar3;
  int iVar4;
  uint uVar5;
  
  aVar1 = Abc_Clock();
  pAVar2 = Amap_ManSetupPis(p);
  p->pCutsPi = pAVar2;
  for (iVar4 = 0; iVar4 < p->vObjs->nSize; iVar4 = iVar4 + 1) {
    pNode = (Amap_Obj_t *)Vec_PtrEntry(p->vObjs,iVar4);
    if ((pNode != (Amap_Obj_t *)0x0) &&
       (((undefined1  [96])*pNode & (undefined1  [96])0x6) == (undefined1  [96])0x4 ||
        ((undefined1  [96])*pNode & (undefined1  [96])0x7) == (undefined1  [96])0x6)) {
      Amap_ManMergeNodeCuts(p,pNode);
    }
  }
  if (p->pPars->fVerbose != 0) {
    printf("AIG object is %d bytes.  ",0x60);
    printf("Internal AIG = %5.2f MB.  Cuts = %5.2f MB.  CutsMax = %d.\n",
           (double)p->vObjs->nSize * 96.0 * 9.5367431640625e-07,
           (double)p->nBytesUsed * 9.5367431640625e-07,(ulong)(uint)p->pPars->nCutsMax);
    uVar5 = p->nObjs[5] + p->nObjs[4] + p->nObjs[6];
    iVar4 = 0x7b5cbc;
    printf("Node =%6d. Try =%9d. Try3 =%10d. Used =%7d. R =%6.2f.  ",
           (double)p->nCutsUsed / (double)(int)uVar5,(ulong)uVar5,(ulong)(uint)p->nCutsTried,
           (ulong)(uint)p->nCutsTried3);
    Abc_Print(iVar4,"%s =","Time ");
    aVar3 = Abc_Clock();
    Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar1) / 1000000.0);
    return;
  }
  return;
}

Assistant:

void Amap_ManMerge( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    p->pCutsPi = Amap_ManSetupPis( p );
    Amap_ManForEachNode( p, pObj, i )
        Amap_ManMergeNodeCuts( p, pObj );
    if ( p->pPars->fVerbose )
    {
        printf( "AIG object is %d bytes.  ", (int)sizeof(Amap_Obj_t) );
        printf( "Internal AIG = %5.2f MB.  Cuts = %5.2f MB.  CutsMax = %d.\n", 
            1.0*Amap_ManObjNum(p)*sizeof(Amap_Obj_t)/(1<<20), 1.0*p->nBytesUsed/(1<<20), p->pPars->nCutsMax );
        printf( "Node =%6d. Try =%9d. Try3 =%10d. Used =%7d. R =%6.2f.  ", 
            Amap_ManNodeNum(p), p->nCutsTried, p->nCutsTried3, p->nCutsUsed, 
            1.0*p->nCutsUsed/Amap_ManNodeNum(p) );
ABC_PRT( "Time ", Abc_Clock() - clk );
    }
}